

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O2

size_t ckh_isearch(ckh_t *ckh,void *key)

{
  size_t sVar1;
  size_t hashes [2];
  
  (*ckh->hash)(key,hashes);
  sVar1 = ckh_bucket_search(ckh,~(-1L << ((byte)ckh->lg_curbuckets & 0x3f)) & hashes[0],key);
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = ckh_bucket_search(ckh,~(-1L << ((byte)ckh->lg_curbuckets & 0x3f)) & hashes[1],key);
  }
  return sVar1;
}

Assistant:

static size_t
ckh_isearch(ckh_t *ckh, const void *key) {
	size_t hashes[2], bucket, cell;

	assert(ckh != NULL);

	ckh->hash(key, hashes);

	/* Search primary bucket. */
	bucket = hashes[0] & ((ZU(1) << ckh->lg_curbuckets) - 1);
	cell = ckh_bucket_search(ckh, bucket, key);
	if (cell != SIZE_T_MAX) {
		return cell;
	}

	/* Search secondary bucket. */
	bucket = hashes[1] & ((ZU(1) << ckh->lg_curbuckets) - 1);
	cell = ckh_bucket_search(ckh, bucket, key);
	return cell;
}